

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.h
# Opt level: O2

CloseSessionRequest * __thiscall
aeron::archive::ArchiveProxy::wrapAndApplyHeader<io::aeron::archive::codecs::CloseSessionRequest>
          (ArchiveProxy *this,CloseSessionRequest *msg)

{
  CloseSessionRequest *pCVar1;
  MessageHeader hdr;
  
  hdr.m_buffer = (char *)0x0;
  hdr.m_offset = 0;
  io::aeron::archive::codecs::MessageHeader::reset
            (&hdr,(char *)(this->buffer_).m_buffer,0,(long)(int)(this->buffer_).m_length,0);
  (hdr.m_buffer + hdr.m_offset)[0] = '\b';
  (hdr.m_buffer + hdr.m_offset)[1] = '\0';
  (hdr.m_buffer + hdr.m_offset + 2)[0] = '\x03';
  (hdr.m_buffer + hdr.m_offset + 2)[1] = '\0';
  (hdr.m_buffer + hdr.m_offset + 4)[0] = '\x01';
  (hdr.m_buffer + hdr.m_offset + 4)[1] = '\0';
  (hdr.m_buffer + hdr.m_offset + 6)[0] = '\0';
  (hdr.m_buffer + hdr.m_offset + 6)[1] = '\0';
  pCVar1 = io::aeron::archive::codecs::CloseSessionRequest::wrapForEncode
                     (msg,(char *)(this->buffer_).m_buffer,8,(long)(int)(this->buffer_).m_length);
  return pCVar1;
}

Assistant:

T& wrapAndApplyHeader(T& msg) {
        constexpr std::uint64_t offset{0};
        io::aeron::archive::codecs::MessageHeader hdr;

        hdr.wrap((char*)buffer_.buffer(), offset, 0, buffer_.capacity())
            .blockLength(T::sbeBlockLength())
            .templateId(T::sbeTemplateId())
            .schemaId(T::sbeSchemaId())
            .version(T::sbeSchemaVersion());

        return msg.wrapForEncode((char*)buffer_.buffer(), offset + hdr.encodedLength(), buffer_.capacity());
    }